

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.h
# Opt level: O0

void __thiscall
ApprovalTests::CartesianProduct::Detail::
find_if_body<ApprovalTests::CartesianProduct::Detail::is_range_empty>::operator()
          (find_if_body<ApprovalTests::CartesianProduct::Detail::is_range_empty> *this,
          vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_> *value)

{
  bool bVar1;
  vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_> *in_RDI;
  is_range_empty *unaff_retaddr;
  
  if (((ulong)in_RDI[1].
              super__Vector_base<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>.
              _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
    bVar1 = is_range_empty::operator()(unaff_retaddr,in_RDI);
    if (bVar1) {
      *(pointer *)
       (in_RDI->super__Vector_base<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>).
       _M_impl.super__Vector_impl_data._M_finish =
           (in_RDI->super__Vector_base<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>)
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined1 *)
       &in_RDI[1].super__Vector_base<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>.
        _M_impl.super__Vector_impl_data._M_start = 1;
    }
    (in_RDI->super__Vector_base<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&((in_RDI->
                           super__Vector_base<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>
                           )._M_impl.super__Vector_impl_data._M_end_of_storage)->field1_ + 1);
  }
  return;
}

Assistant:

void operator()(T&& value)
                {
                    if (found)
                        return;
                    if (pred(std::forward<T>(value)))
                    {
                        index = currentIndex;
                        found = true;
                    }
                    ++currentIndex;
                }